

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult.cpp
# Opt level: O0

bool __thiscall QSqlResult::prepare(QSqlResult *this,QString *query)

{
  long lVar1;
  bool bVar2;
  QSqlResultPrivate *pQVar3;
  QString *in_RSI;
  long in_FS_OFFSET;
  QSqlResultPrivate *d;
  QString *in_stack_00000038;
  QSqlResultPrivate *in_stack_00000040;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QSqlResult *)0x143c2a);
  QString::operator=(&pQVar3->sql,in_RSI);
  bVar2 = QList<QHolder>::isEmpty((QList<QHolder> *)0x143c50);
  if (bVar2) {
    QSqlResultPrivate::namedToPositionalBinding(in_stack_00000040,in_stack_00000038);
    QString::~QString((QString *)0x143c73);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool QSqlResult::prepare(const QString& query)
{
    Q_D(QSqlResult);
    d->sql = query;
    if (d->holders.isEmpty()) {
        // parse the query to memorize parameter location
        d->namedToPositionalBinding(query);
    }
    return true; // fake prepares should always succeed
}